

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O1

bool selective_repeat_new_create_line_allowed_proc
               (Am_Object command_obj,Am_Value *new_selection,Am_Value param_3)

{
  char cVar1;
  bool bVar2;
  Am_Object *pAVar3;
  Am_Object orig_line;
  Am_Object AStack_18;
  
  pAVar3 = &AStack_18;
  cVar1 = Am_Value::Valid();
  if ((cVar1 == '\0') || (new_selection->type != 0xa001)) {
    bVar2 = false;
  }
  else {
    Am_Object::Am_Object(&AStack_18,new_selection);
    bVar2 = internal_selective_repeat_create_line_allowed(pAVar3,&AStack_18);
    Am_Object::~Am_Object(&AStack_18);
  }
  return bVar2;
}

Assistant:

Am_Define_Method(Am_Selective_New_Allowed_Method, bool,
		 selective_repeat_new_create_line_allowed,
		 (Am_Object command_obj, Am_Value new_selection,
		  Am_Value /* new_value */)) {
  if (new_selection.Valid() && new_selection.type == Am_OBJECT) {
    Am_Object orig_line = new_selection;
    return internal_selective_repeat_create_line_allowed(command_obj,
							 orig_line);
  }
  return false;
}